

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  int iVar1;
  lua_State *L_00;
  size_t sVar2;
  int in_ECX;
  char *in_RDX;
  lua_State *in_RDI;
  char *e;
  int in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  char *local_20;
  
  lua_pushvalue(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_20 = in_RDX;
  do {
    L_00 = (lua_State *)strchr(local_20,0x2e);
    if (L_00 == (lua_State *)0x0) {
      in_stack_ffffffffffffffc8 = local_20;
      sVar2 = strlen(local_20);
      L_00 = (lua_State *)(in_stack_ffffffffffffffc8 + sVar2);
    }
    lua_pushlstring(L_00,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
    lua_rawget(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    iVar1 = lua_type(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (iVar1 == 0) {
      lua_settop(in_RDI,-2);
      iVar1 = in_ECX;
      if (*(char *)&L_00->next == '.') {
        iVar1 = 1;
      }
      in_stack_ffffffffffffffc0 = in_RDI;
      lua_createtable(in_RDI,iVar1,in_stack_ffffffffffffffb8);
      lua_pushlstring(L_00,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
      lua_pushvalue(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      lua_settable(in_stack_ffffffffffffffc0,iVar1);
    }
    else {
      iVar1 = lua_type(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      if (iVar1 != 5) {
        lua_settop(in_RDI,-3);
        return local_20;
      }
    }
    lua_remove(L_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    local_20 = (char *)((long)&L_00->next + 1);
  } while (*(char *)&L_00->next == '.');
  return (char *)0x0;
}

Assistant:

static const char*luaL_findtable(lua_State*L,int idx,
const char*fname,int szhint){
const char*e;
lua_pushvalue(L,idx);
do{
e=strchr(fname,'.');
if(e==NULL)e=fname+strlen(fname);
lua_pushlstring(L,fname,e-fname);
lua_rawget(L,-2);
if(lua_isnil(L,-1)){
lua_pop(L,1);
lua_createtable(L,0,(*e=='.'?1:szhint));
lua_pushlstring(L,fname,e-fname);
lua_pushvalue(L,-2);
lua_settable(L,-4);
}
else if(!lua_istable(L,-1)){
lua_pop(L,2);
return fname;
}
lua_remove(L,-2);
fname=e+1;
}while(*e=='.');
return NULL;
}